

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O0

size_t ZSTD_crossEntropyCost(short *norm,uint accuracyLog,uint *count,uint max)

{
  uint uVar1;
  int local_40;
  uint norm256;
  uint normAcc;
  uint s;
  size_t cost;
  uint shift;
  uint max_local;
  uint *count_local;
  uint accuracyLog_local;
  short *norm_local;
  
  _normAcc = 0;
  if (8 < accuracyLog) {
    __assert_fail("accuracyLog <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                  ,0x91,
                  "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                 );
  }
  norm256 = 0;
  while( true ) {
    if (max < norm256) {
      return _normAcc >> 8;
    }
    if (norm[norm256] == -1) {
      local_40 = 1;
    }
    else {
      local_40 = (int)norm[norm256];
    }
    uVar1 = local_40 << (8U - (char)accuracyLog & 0x1f);
    if (uVar1 == 0) break;
    if (0xff < uVar1) {
      __assert_fail("norm256 < 256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                    ,0x96,
                    "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
                   );
    }
    _normAcc = count[norm256] * kInverseProbabilityLog256[uVar1] + _normAcc;
    norm256 = norm256 + 1;
  }
  __assert_fail("norm256 > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_sequences.c"
                ,0x95,
                "size_t ZSTD_crossEntropyCost(const short *, unsigned int, const unsigned int *, const unsigned int)"
               );
}

Assistant:

size_t ZSTD_crossEntropyCost(short const* norm, unsigned accuracyLog,
                             unsigned const* count, unsigned const max)
{
    unsigned const shift = 8 - accuracyLog;
    size_t cost = 0;
    unsigned s;
    assert(accuracyLog <= 8);
    for (s = 0; s <= max; ++s) {
        unsigned const normAcc = (norm[s] != -1) ? (unsigned)norm[s] : 1;
        unsigned const norm256 = normAcc << shift;
        assert(norm256 > 0);
        assert(norm256 < 256);
        cost += count[s] * kInverseProbabilityLog256[norm256];
    }
    return cost >> 8;
}